

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.h
# Opt level: O2

result_type __thiscall MeCab::Dictionary::exactMatchSearch(Dictionary *this,char *key)

{
  result_type rVar2;
  size_t sVar3;
  result_pair_type rVar1;
  
  rVar1 = Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
          exactMatchSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                    ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                      *)&this->da_,key,0,0);
  rVar2.value = rVar1.value;
  rVar2._4_4_ = rVar1._4_4_;
  register0x00000010 = rVar1.length;
  return rVar2;
}

Assistant:

result_type exactMatchSearch(const char* key) const {
    result_type n;
    da_.exactMatchSearch(key, n);
    return n;
  }